

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annex_storage.h
# Opt level: O0

value_t __thiscall
lume::AnnexStorage<lume::Mesh::AnnexKey,lume::Annex>::optional_annex<lume::ArrayAnnex<unsigned_int>>
          (AnnexStorage<lume::Mesh::AnnexKey,lume::Annex> *this,AnnexKey *id)

{
  bool bVar1;
  pointer ppVar2;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  value_t vVar4;
  shared_ptr<lume::ArrayAnnex<unsigned_int>_> local_40;
  _Self local_30;
  _Self local_28;
  iterator i;
  AnnexKey *id_local;
  AnnexStorage<lume::Mesh::AnnexKey,_lume::Annex> *this_local;
  
  local_28._M_node =
       (_Base_ptr)
       std::
       map<lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
       ::find((map<lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
               *)id,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
       ::end((map<lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>,_std::less<lume::Mesh::AnnexKey>,_std::allocator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>_>
              *)id);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::shared_ptr<lume::ArrayAnnex<unsigned_int>_>::shared_ptr(&local_40);
    std::shared_ptr<lume::Annex>::shared_ptr<lume::ArrayAnnex<unsigned_int>,void>
              ((shared_ptr<lume::Annex> *)this,&local_40);
    std::shared_ptr<lume::ArrayAnnex<unsigned_int>_>::~shared_ptr(&local_40);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_lume::Mesh::AnnexKey,_std::shared_ptr<lume::Annex>_>_>
             ::operator->(&local_28);
    std::shared_ptr<lume::Annex>::shared_ptr((shared_ptr<lume::Annex> *)this,&ppVar2->second);
    _Var3._M_pi = extraout_RDX_00;
  }
  vVar4.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  vVar4.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (value_t)vVar4.super___shared_ptr<lume::Annex,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_t optional_annex (const TKey& id)
	{
		auto i = m_annexMap.find (id);
		if (i == m_annexMap.end())
			return std::shared_ptr<TConcreteType>();
		return i->second;
	}